

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O0

MPP_RET mpp_dec_start_normal(MppDecImpl *dec)

{
  MppThread *pMVar1;
  MppDecImpl *dec_local;
  
  if (dec->coding == MPP_VIDEO_CodingMJPEG) {
    pMVar1 = (MppThread *)operator_new(0x198);
    MppThread::MppThread(pMVar1,mpp_dec_advanced_thread,dec->mpp,"mpp_dec_parser");
    dec->thread_parser = pMVar1;
    MppThread::start(dec->thread_parser);
  }
  else {
    pMVar1 = (MppThread *)operator_new(0x198);
    MppThread::MppThread(pMVar1,mpp_dec_parser_thread,dec->mpp,"mpp_dec_parser");
    dec->thread_parser = pMVar1;
    MppThread::start(dec->thread_parser);
    pMVar1 = (MppThread *)operator_new(0x198);
    MppThread::MppThread(pMVar1,mpp_dec_hal_thread,dec->mpp,"mpp_dec_hal");
    dec->thread_hal = pMVar1;
    MppThread::start(dec->thread_hal);
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_dec_start_normal(MppDecImpl *dec)
{
    if (dec->coding != MPP_VIDEO_CodingMJPEG) {
        dec->thread_parser = new MppThread(mpp_dec_parser_thread,
                                           dec->mpp, "mpp_dec_parser");
        dec->thread_parser->start();
        dec->thread_hal = new MppThread(mpp_dec_hal_thread,
                                        dec->mpp, "mpp_dec_hal");

        dec->thread_hal->start();
    } else {
        dec->thread_parser = new MppThread(mpp_dec_advanced_thread,
                                           dec->mpp, "mpp_dec_parser");
        dec->thread_parser->start();
    }

    return MPP_OK;
}